

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::HttpByteRange> * __thiscall
kj::ArrayBuilder<kj::HttpByteRange>::operator=
          (ArrayBuilder<kj::HttpByteRange> *this,ArrayBuilder<kj::HttpByteRange> *other)

{
  ArrayBuilder<kj::HttpByteRange> *other_local;
  ArrayBuilder<kj::HttpByteRange> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (HttpByteRange *)0x0;
  other->pos = (RemoveConst<kj::HttpByteRange> *)0x0;
  other->endPtr = (HttpByteRange *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }